

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall QFontCache::updateHitCountAndTimeStamp(QFontCache *this,Engine *value)

{
  uint uVar1;
  
  value->hits = value->hits + 1;
  uVar1 = this->current_timestamp + 1;
  this->current_timestamp = uVar1;
  value->timestamp = uVar1;
  return;
}

Assistant:

void QFontCache::updateHitCountAndTimeStamp(Engine &value)
{
    value.hits++;
    value.timestamp = ++current_timestamp;

    FC_DEBUG("QFontCache: found font engine\n"
             "  %p: timestamp %4u hits %3u ref %2d/%2d, type %d",
             value.data, value.timestamp, value.hits,
             value.data->ref.loadRelaxed(), engineCacheCount.value(value.data),
             value.data->type());
}